

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detection.cpp
# Opt level: O0

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::detection::groupLetters
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *segments)

{
  pointer *ppSVar1;
  bool bVar2;
  reference this;
  reference this_00;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  reference pSVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  pair<double,_double> pVar12;
  pair<double,_double> pVar13;
  double local_548;
  double local_538;
  double local_510;
  double local_500;
  double local_4d8;
  double local_4c8;
  undefined1 local_468 [8];
  Segment bbox;
  pair<double,_double> thisGlobalCenter_2;
  Segment *thisSegment_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range3_2;
  double expectedCenterYMax_2;
  double expectedCenterYMin_2;
  double expectedCenterXMax_2;
  double expectedCenterXMin_2;
  pair<double,_double> thisGlobalCenter_1;
  Segment *thisSegment_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range3_1;
  double expectedCenterYMax_1;
  double expectedCenterYMin_1;
  double expectedCenterXMax_1;
  double expectedCenterXMin_1;
  pair<double,_double> thisGlobalCenter;
  Segment *thisSegment;
  iterator __end3;
  iterator __begin3;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range3;
  double expectedCenterYMax;
  double expectedCenterYMin;
  double expectedCenterXMax;
  double expectedCenterXMin;
  double yDiff;
  double xDiff;
  Segment segmentC;
  Segment segmentS;
  Segment segmentE;
  double ratio;
  double expectedDistance;
  double avgWidth;
  double distance;
  pair<double,_double> oGlobalCenter;
  pair<double,_double> tGlobalCenter;
  Segment *segmentO;
  iterator __end2;
  iterator __begin2;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range2;
  Segment *segmentT;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range1_1;
  undefined1 local_d8 [8];
  string classification;
  Segment *segment;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *__range1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersO;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersC;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersS;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersE;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersT;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *segments_local;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *boundingBoxes;
  
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&lettersE.
               super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&lettersS.
               super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&lettersC.
               super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&lettersO.
               super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *)&__range1);
  __end1 = std::
           vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           ::begin(segments);
  segment = (Segment *)
            std::
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            ::end(segments);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                     *)&segment), bVar2) {
    classification.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
         ::operator*(&__end1);
    structs::Segment::classify_abi_cxx11_
              ((string *)local_d8,(Segment *)classification.field_2._8_8_);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"LETTER_T");
    if (bVar2) {
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::push_back((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                   *)&lettersE.
                      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)classification.field_2._8_8_);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"LETTER_E");
      if (bVar2) {
        std::
        vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
        ::push_back((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                     *)&lettersS.
                        super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)classification.field_2._8_8_);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d8,"LETTER_S");
        if (bVar2) {
          std::
          vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
          ::push_back((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       *)&lettersC.
                          super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)classification.field_2._8_8_);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,"LETTER_C");
          if (bVar2) {
            std::
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            ::push_back((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                         *)&lettersO.
                            super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)classification.field_2._8_8_);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8,"LETTER_O");
            if (bVar2) {
              std::
              vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ::push_back((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                           *)&__range1,(value_type *)classification.field_2._8_8_);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_d8);
    __gnu_cxx::
    __normal_iterator<const_pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
    ::operator++(&__end1);
  }
  ppSVar1 = &lettersE.
             super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      *)ppSVar1);
  segmentT = (Segment *)
             std::
             vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    *)ppSVar1);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                        *)&segmentT);
    if (!bVar2) {
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 *)&__range1);
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 *)&lettersO.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 *)&lettersC.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 *)&lettersS.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 *)&lettersE.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    this = __gnu_cxx::
           __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
           ::operator*(&__end1_1);
    __end2 = std::
             vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      *)&__range1);
    segmentO = (Segment *)
               std::
               vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                       *)&segmentO), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                ::operator*(&__end2);
      pVar12 = structs::Segment::getGlobalCenter(this);
      dVar11 = pVar12.second;
      dVar7 = pVar12.first;
      pVar12 = structs::Segment::getGlobalCenter(this_00);
      if (dVar7 - pVar12.first <= 0.0) {
        dVar8 = structs::Segment::getDistance(this,this_00);
        uVar3 = structs::Segment::getWidth(this);
        uVar4 = structs::Segment::getWidth(this_00);
        lVar5 = uVar3 + uVar4;
        auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar10._0_8_ = lVar5;
        auVar10._12_4_ = 0x45300000;
        dVar8 = dVar8 / ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 2.0) *
                        4.0);
        if ((0.8 <= dVar8) && (dVar8 <= 1.2)) {
          structs::Segment::Segment((Segment *)&segmentS.pixels.field_0x58);
          structs::Segment::Segment((Segment *)&segmentC.pixels.field_0x58);
          structs::Segment::Segment((Segment *)&xDiff);
          dVar8 = (pVar12.first - dVar7) / 4.0;
          dVar9 = (pVar12.second - dVar11) / 4.0;
          if (dVar9 <= 0.0) {
            local_4c8 = dVar9 - 1.0;
          }
          else {
            local_4c8 = dVar9 + 1.0;
          }
          if (dVar9 <= 0.0) {
            local_4d8 = dVar9 - 1.0;
          }
          else {
            local_4d8 = dVar9 + 1.0;
          }
          ppSVar1 = &lettersS.
                     super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3 = std::
                   vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                   ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                            *)ppSVar1);
          thisSegment = (Segment *)
                        std::
                        vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                        ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                               *)ppSVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                             *)&thisSegment), bVar2) {
            pSVar6 = __gnu_cxx::
                     __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                     ::operator*(&__end3);
            pVar13 = structs::Segment::getGlobalCenter(pSVar6);
            if ((((dVar8 * -1.5 + dVar8 * 0.0 + dVar7 <= pVar13.first) &&
                 (pVar13.first <= dVar8 * 1.5 + dVar8 * 0.0 + dVar7)) &&
                (local_4c8 *
                 (double)(~-(ulong)(0.0 < dVar9) & 0x3ff8000000000000 |
                         (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0xbff80000) << 0x20) +
                 dVar9 * 0.0 + dVar11 <= pVar13.second)) &&
               (pVar13.second <=
                local_4d8 *
                (double)(~-(ulong)(0.0 < dVar9) & 0xbff8000000000000 |
                        (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0x3ff80000) << 0x20) +
                dVar9 * 0.0 + dVar11)) {
              structs::Segment::operator=((Segment *)&segmentS.pixels.field_0x58,pSVar6);
              break;
            }
            __gnu_cxx::
            __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
            ::operator++(&__end3);
          }
          bVar2 = structs::Segment::isValid((Segment *)&segmentS.pixels.field_0x58);
          if (bVar2) {
            if (dVar9 <= 0.0) {
              local_500 = dVar9 - 1.0;
            }
            else {
              local_500 = dVar9 + 1.0;
            }
            if (dVar9 <= 0.0) {
              local_510 = dVar9 - 1.0;
            }
            else {
              local_510 = dVar9 + 1.0;
            }
            ppSVar1 = &lettersC.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end3_1 = std::
                       vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                                *)ppSVar1);
            thisSegment_1 =
                 (Segment *)
                 std::
                 vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                        *)ppSVar1);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                       *)&thisSegment_1), bVar2) {
              pSVar6 = __gnu_cxx::
                       __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                       ::operator*(&__end3_1);
              pVar13 = structs::Segment::getGlobalCenter(pSVar6);
              if (((dVar8 * -1.5 + dVar8 + dVar7 <= pVar13.first) &&
                  (pVar13.first <= dVar8 * 1.5 + dVar8 + dVar7)) &&
                 ((local_500 *
                   (double)(~-(ulong)(0.0 < dVar9) & 0x3ff8000000000000 |
                           (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0xbff80000) << 0x20) +
                   dVar9 + dVar11 <= pVar13.second &&
                  (pVar13.second <=
                   local_510 *
                   (double)(~-(ulong)(0.0 < dVar9) & 0xbff8000000000000 |
                           (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0x3ff80000) << 0x20) +
                   dVar9 + dVar11)))) {
                structs::Segment::operator=((Segment *)&segmentC.pixels.field_0x58,pSVar6);
                break;
              }
              __gnu_cxx::
              __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
              ::operator++(&__end3_1);
            }
            bVar2 = structs::Segment::isValid((Segment *)&segmentC.pixels.field_0x58);
            if (bVar2) {
              if (dVar9 <= 0.0) {
                local_538 = dVar9 - 1.0;
              }
              else {
                local_538 = dVar9 + 1.0;
              }
              if (dVar9 <= 0.0) {
                local_548 = dVar9 - 1.0;
              }
              else {
                local_548 = dVar9 + 1.0;
              }
              ppSVar1 = &lettersO.
                         super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              __end3_2 = std::
                         vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                         ::begin((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                                  *)ppSVar1);
              thisSegment_2 =
                   (Segment *)
                   std::
                   vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                   ::end((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                          *)ppSVar1);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end3_2,
                                        (__normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                                         *)&thisSegment_2), bVar2) {
                pSVar6 = __gnu_cxx::
                         __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                         ::operator*(&__end3_2);
                pVar13 = structs::Segment::getGlobalCenter(pSVar6);
                bbox.pixels._88_8_ = pVar13.first;
                if (((dVar8 * -1.5 + dVar8 + dVar8 + dVar7 <= (double)bbox.pixels._88_8_) &&
                    ((double)bbox.pixels._88_8_ <= dVar8 * 1.5 + dVar8 + dVar8 + dVar7)) &&
                   ((local_538 *
                     (double)(~-(ulong)(0.0 < dVar9) & 0x3ff8000000000000 |
                             (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0xbff80000) << 0x20) +
                     dVar9 + dVar9 + dVar11 <= pVar13.second &&
                    (pVar13.second <=
                     local_548 *
                     (double)(~-(ulong)(0.0 < dVar9) & 0xbff8000000000000 |
                             (ulong)((uint)(-(ulong)(0.0 < dVar9) >> 0x20) & 0x3ff80000) << 0x20) +
                     dVar9 + dVar9 + dVar11)))) {
                  structs::Segment::operator=((Segment *)&xDiff,pSVar6);
                  break;
                }
                __gnu_cxx::
                __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
                ::operator++(&__end3_2);
              }
              bVar2 = structs::Segment::isValid((Segment *)&xDiff);
              if (bVar2) {
                structs::Segment::Segment((Segment *)local_468);
                local_468 = (undefined1  [8])this->xMin;
                bbox.xMin = this_00->xMax;
                if (pVar12.second <= dVar11) {
                  bbox.xMax = this_00->yMin;
                  bbox.yMin = this->yMax;
                }
                else {
                  bbox.xMax = this->yMin;
                  bbox.yMin = this_00->yMax;
                }
                std::
                vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ::push_back(__return_storage_ptr__,(value_type *)local_468);
                structs::Segment::~Segment((Segment *)local_468);
              }
            }
          }
          structs::Segment::~Segment((Segment *)&xDiff);
          structs::Segment::~Segment((Segment *)&segmentC.pixels.field_0x58);
          structs::Segment::~Segment((Segment *)&segmentS.pixels.field_0x58);
        }
      }
      __gnu_cxx::
      __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<pobr::imgProcessing::structs::Segment_*,_std::vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

std::vector<structs::Segment> 
detection::groupLetters(
    const std::vector<structs::Segment>& segments
)
{
    std::vector<structs::Segment> boundingBoxes;

    std::vector<structs::Segment> lettersT;
    std::vector<structs::Segment> lettersE;
    std::vector<structs::Segment> lettersS;
    std::vector<structs::Segment> lettersC;
    std::vector<structs::Segment> lettersO;

    for (const auto& segment: segments) {
        const auto classification = segment.classify();

        if (classification == "LETTER_T") {
            lettersT.push_back(segment);
            continue;
        }
        if (classification == "LETTER_E") {
            lettersE.push_back(segment);
            continue;
        }
        if (classification == "LETTER_S") {
            lettersS.push_back(segment);
            continue;
        }
        if (classification == "LETTER_C") {
            lettersC.push_back(segment);
            continue;
        }
        if (classification == "LETTER_O") {
            lettersO.push_back(segment);
            continue;
        }
    }

    for (const auto& segmentT: lettersT) {
        for (const auto& segmentO: lettersO) {
            // Do not detect mirrored images
            const auto tGlobalCenter = segmentT.getGlobalCenter();
            const auto oGlobalCenter = segmentO.getGlobalCenter();

            if (tGlobalCenter.first - oGlobalCenter.first > 0) {
                continue;
            }

            const auto distance = structs::Segment::getDistance(segmentT, segmentO);
            const auto avgWidth = ((double) (segmentT.getWidth() + segmentO.getWidth())) / 2;
            const auto expectedDistance = avgWidth * 4;

            const auto ratio = distance / expectedDistance;

            // If distance seems too long or too short, skip it
            if (ratio < 0.8 || ratio > 1.2) {
                continue;
            }

            // Interpolate possible places for next letters
            structs::Segment segmentE;
            structs::Segment segmentS;
            structs::Segment segmentC;

            const auto xDiff = ((double) (oGlobalCenter.first - tGlobalCenter.first)) / 4;
            const auto yDiff = ((double) (oGlobalCenter.second - tGlobalCenter.second)) / 4;

            // - Find letter E
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 0) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 0) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersE) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentE = thisSegment;

                    break;
                }

                if (!segmentE.isValid()) {
                    continue;
                }
            }

            // - Find letter S
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 1) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 1) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersS) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentS = thisSegment;

                    break;
                }

                if (!segmentS.isValid()) {
                    continue;
                }
            }

            // - Find letter C
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 2) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 2) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersC) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentC = thisSegment;

                    break;
                }

                if (!segmentC.isValid()) {
                    continue;
                }
            }

            // Found all letters, store bounding box and skip to next T letter
            structs::Segment bbox;

            bbox.xMin = segmentT.xMin;
            bbox.xMax = segmentO.xMax;

            if (tGlobalCenter.second < oGlobalCenter.second) {
                // Top to bottom
                bbox.yMin = segmentT.yMin;
                bbox.yMax = segmentO.yMax;
            } else {
                // Bottom to top
                bbox.yMin = segmentO.yMin;
                bbox.yMax = segmentT.yMax;
            }

            // Note: possible slight optimisation
            //       remove used letters from containers to prevent re-checking them

            boundingBoxes.push_back(bbox);
        }
    }

    return boundingBoxes;
}